

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void expandFormatArguments<String>(vector<String,_std::allocator<String>_> *data,String *arg)

{
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,(string *)arg);
  std::vector<String,_std::allocator<String>_>::push_back(data,(value_type *)local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void expandFormatArguments (std::vector<String>& data, const T& arg, const RestTypes& ... rest)
{
	data.push_back (FormatArgument (arg).text());
	expandFormatArguments (data, rest...);
}